

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSampleVerifier.cpp
# Opt level: O3

bool __thiscall
vkt::texture::SampleVerifier::verifySampleTexelGridCoords
          (SampleVerifier *this,SampleArguments *args,Vec4 *result,IVec3 *gridCoordHi,
          IVec3 *gridCoordLo,Vec2 *lodBounds,int level,VkSamplerMipmapMode mipmapFilter,
          ostream *report)

{
  float fVar1;
  float fVar2;
  double dVar3;
  long lVar4;
  bool bVar5;
  int layer;
  ostream *poVar6;
  long lVar7;
  VkFilter filter;
  VkSamplerMipmapMode mipmapFilter_00;
  Vec4 idealMin;
  Vec4 idealMax;
  IVec3 baseTexel [2];
  IVec3 texelGridOffset [2];
  IVec3 gridCoord [2];
  
  layer = 0;
  if (this->m_imParams->isArrayed == true) {
    dVar3 = deRoundEven((double)args->layer);
    layer = (int)dVar3;
  }
  gridCoord[0].m_data[2] = gridCoordHi->m_data[2];
  gridCoord[0].m_data._0_8_ = *(undefined8 *)gridCoordHi->m_data;
  gridCoord[1].m_data._0_8_ = *(undefined8 *)gridCoordLo->m_data;
  gridCoord[1].m_data[2] = gridCoordLo->m_data[2];
  baseTexel[1].m_data[1] = 0;
  baseTexel[1].m_data[2] = 0;
  baseTexel[0].m_data[0] = 0;
  baseTexel[0].m_data[1] = 0;
  baseTexel[0].m_data[2] = 0;
  baseTexel[1].m_data[0] = 0;
  texelGridOffset[1].m_data[1] = 0;
  texelGridOffset[1].m_data[2] = 0;
  texelGridOffset[0].m_data[0] = 0;
  texelGridOffset[0].m_data[1] = 0;
  texelGridOffset[0].m_data[2] = 0;
  texelGridOffset[1].m_data[0] = 0;
  util::calcTexelBaseOffset(gridCoord,this->m_coordBits,baseTexel,texelGridOffset);
  util::calcTexelBaseOffset(gridCoord + 1,this->m_coordBits,baseTexel + 1,texelGridOffset + 1);
  fVar1 = lodBounds->m_data[1];
  if (lodBounds->m_data[0] <= 0.0) {
    std::__ostream_insert<char,std::char_traits<char>>(report,"Trying magnification...\n",0x18);
    if (this->m_samplerParams->magFilter == VK_FILTER_NEAREST) {
      std::__ostream_insert<char,std::char_traits<char>>
                (report,"Testing against nearest texel at ",0x21);
      poVar6 = tcu::operator<<(report,baseTexel);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
      idealMin.m_data[0] = 0.0;
      idealMin.m_data[1] = 0.0;
      idealMin.m_data[2] = 0.0;
      idealMin.m_data[3] = 0.0;
      idealMax.m_data[0] = 0.0;
      idealMax.m_data[1] = 0.0;
      idealMax.m_data[2] = 0.0;
      idealMax.m_data[3] = 0.0;
      fetchTexel(this,baseTexel,layer,level,VK_FILTER_NEAREST,&idealMin,&idealMax);
      if ((idealMin.m_data[0] <= result->m_data[0]) && (result->m_data[0] <= idealMax.m_data[0])) {
        lVar4 = 1;
        do {
          lVar7 = lVar4;
          if ((lVar7 == 4) || (fVar2 = result->m_data[lVar7], fVar2 < idealMin.m_data[lVar7]))
          break;
          lVar4 = lVar7 + 1;
        } while (fVar2 < idealMax.m_data[lVar7] || fVar2 == idealMax.m_data[lVar7]);
        if (2 < lVar7 - 1U) {
          return true;
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>(report,"Failed against ",0xf);
      poVar6 = tcu::operator<<(report,&idealMin);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," through ",9);
      poVar6 = tcu::operator<<(poVar6,&idealMax);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
    }
    else {
      idealMin.m_data[0] = 0.0;
      idealMin.m_data[1] = 0.0;
      bVar5 = verifySampleFiltered
                        (this,result,baseTexel,baseTexel + 1,texelGridOffset,texelGridOffset + 1,
                         layer,level,(Vec2 *)&idealMin,VK_FILTER_LINEAR,
                         VK_SAMPLER_MIPMAP_MODE_NEAREST,report);
      if (bVar5) {
        return true;
      }
    }
  }
  if (0.0 < fVar1) {
    std::__ostream_insert<char,std::char_traits<char>>(report,"Trying minification...\n",0x17);
    if (mipmapFilter == VK_SAMPLER_MIPMAP_MODE_LINEAR) {
      idealMin.m_data[0] = (float)*(undefined8 *)lodBounds->m_data - (float)level;
      idealMin.m_data[1] = (float)((ulong)*(undefined8 *)lodBounds->m_data >> 0x20) - (float)level;
      filter = this->m_samplerParams->minFilter;
      mipmapFilter_00 = VK_SAMPLER_MIPMAP_MODE_LINEAR;
    }
    else {
      if (this->m_samplerParams->minFilter != VK_FILTER_LINEAR) {
        std::__ostream_insert<char,std::char_traits<char>>
                  (report,"Testing against nearest texel at ",0x21);
        poVar6 = tcu::operator<<(report,baseTexel);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
        idealMin.m_data[0] = 0.0;
        idealMin.m_data[1] = 0.0;
        idealMin.m_data[2] = 0.0;
        idealMin.m_data[3] = 0.0;
        idealMax.m_data[0] = 0.0;
        idealMax.m_data[1] = 0.0;
        idealMax.m_data[2] = 0.0;
        idealMax.m_data[3] = 0.0;
        fetchTexel(this,baseTexel,layer,level,VK_FILTER_NEAREST,&idealMin,&idealMax);
        if ((idealMin.m_data[0] <= result->m_data[0]) && (result->m_data[0] <= idealMax.m_data[0]))
        {
          lVar4 = 1;
          do {
            lVar7 = lVar4;
            if ((lVar7 == 4) || (fVar1 = result->m_data[lVar7], fVar1 < idealMin.m_data[lVar7]))
            break;
            lVar4 = lVar7 + 1;
          } while (fVar1 < idealMax.m_data[lVar7] || fVar1 == idealMax.m_data[lVar7]);
          if (2 < lVar7 - 1U) {
            return true;
          }
        }
        std::__ostream_insert<char,std::char_traits<char>>(report,"Failed against ",0xf);
        poVar6 = tcu::operator<<(report,&idealMin);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," through ",9);
        poVar6 = tcu::operator<<(poVar6,&idealMax);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
        return false;
      }
      idealMin.m_data[0] = 0.0;
      idealMin.m_data[1] = 0.0;
      mipmapFilter_00 = VK_SAMPLER_MIPMAP_MODE_NEAREST;
      filter = VK_FILTER_LINEAR;
    }
    bVar5 = verifySampleFiltered
                      (this,result,baseTexel,baseTexel + 1,texelGridOffset,texelGridOffset + 1,layer
                       ,level,(Vec2 *)&idealMin,filter,mipmapFilter_00,report);
    if (bVar5) {
      return true;
    }
  }
  return false;
}

Assistant:

bool SampleVerifier::verifySampleTexelGridCoords (const SampleArguments&	args,
												  const Vec4&				result,
												  const IVec3&				gridCoordHi,
												  const IVec3&				gridCoordLo,
												  const Vec2&				lodBounds,
												  int						level,
												  VkSamplerMipmapMode		mipmapFilter,
												  std::ostream&				report) const
{
	const int	layer		 = m_imParams.isArrayed ? (int)deRoundEven(args.layer) : 0U;
	const IVec3 gridCoord[2] = {gridCoordHi, gridCoordLo};

	IVec3 baseTexel[2];
	IVec3 texelGridOffset[2];

    for (int levelNdx = 0; levelNdx < 2; ++levelNdx)
	{
		calcTexelBaseOffset(gridCoord[levelNdx], m_coordBits, baseTexel[levelNdx], texelGridOffset[levelNdx]);
	}

	const bool	canBeMinified  = lodBounds[1] > 0.0f;
	const bool	canBeMagnified = lodBounds[0] <= 0.0f;

	if (canBeMagnified)
	{
		report << "Trying magnification...\n";

		if (m_samplerParams.magFilter == VK_FILTER_NEAREST)
		{
			report << "Testing against nearest texel at " << baseTexel[0] << "\n";

			Vec4 idealMin;
			Vec4 idealMax;

			fetchTexel(baseTexel[0], layer, level, VK_FILTER_NEAREST, idealMin, idealMax);

			if (isInRange(result, idealMin, idealMax))
		    {
				return true;
			}
			else
			{
				report << "Failed against " << idealMin << " through " << idealMax << "\n";
			}
		}
		else
		{
			if  (verifySampleFiltered(result, baseTexel[0], baseTexel[1], texelGridOffset[0], texelGridOffset[1], layer, level, Vec2(0.0f, 0.0f), VK_FILTER_LINEAR, VK_SAMPLER_MIPMAP_MODE_NEAREST, report))
				return true;
		}
	}

	if (canBeMinified)
	{
		report << "Trying minification...\n";

		if (mipmapFilter == VK_SAMPLER_MIPMAP_MODE_LINEAR)
		{
			const Vec2 lodFracBounds = lodBounds - Vec2((float)level);

			if (verifySampleFiltered(result, baseTexel[0], baseTexel[1], texelGridOffset[0], texelGridOffset[1], layer, level, lodFracBounds, m_samplerParams.minFilter, VK_SAMPLER_MIPMAP_MODE_LINEAR, report))
				return true;
		}
		else if (m_samplerParams.minFilter == VK_FILTER_LINEAR)
		{
		    if (verifySampleFiltered(result, baseTexel[0], baseTexel[1], texelGridOffset[0], texelGridOffset[1], layer, level, Vec2(0.0f, 0.0f), VK_FILTER_LINEAR, VK_SAMPLER_MIPMAP_MODE_NEAREST, report))
				return true;
		}
		else
		{
			report << "Testing against nearest texel at " << baseTexel[0] << "\n";

			Vec4 idealMin;
			Vec4 idealMax;

		    fetchTexel(baseTexel[0], layer, level, VK_FILTER_NEAREST, idealMin, idealMax);

			if (isInRange(result, idealMin, idealMax))
		    {
				return true;
			}
			else
			{
				report << "Failed against " << idealMin << " through " << idealMax << "\n";
			}
		}
	}

	return false;
}